

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.c
# Opt level: O1

Expr gc_collect_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                       Expr *args,int argc)

{
  Expr EVar1;
  int objects;
  int pairs;
  int atoms;
  Expr arr [3];
  int local_64;
  int local_60;
  int local_5c;
  Expr local_58;
  ValueType local_48;
  anon_union_8_8_707b72ea_for_Expr_1 local_40;
  ValueType local_38;
  anon_union_8_8_707b72ea_for_Expr_1 local_30;
  
  if (argc == 0) {
    gc_collectv(exec,&local_5c,&local_60,&local_64);
    EVar1 = make_int_from_long(exec,(long)local_5c);
    local_58.field_1 = EVar1.field_1;
    local_58.type = EVar1.type;
    EVar1 = make_int_from_long(exec,(long)local_60);
    local_40 = EVar1.field_1;
    local_48 = EVar1.type;
    EVar1 = make_int_from_long(exec,(long)local_64);
    local_30 = EVar1.field_1;
    local_38 = EVar1.type;
    EVar1 = make_list(exec,&local_58,3);
    return EVar1;
  }
  puts("gc-collect: too many arguments");
  exit(1);
}

Assistant:

BUILTIN_FUNC(gc_collect_builtin)
{
    if (argc != 0)
    {
        log("gc-collect: too many arguments");
        exit(1);
    }
    int atoms, pairs, objects;
    gc_collectv(exec, &atoms, &pairs, &objects);
    Expr arr[3] =
            {
                    make_int_from_long(exec, atoms),
                    make_int_from_long(exec, pairs),
                    make_int_from_long(exec, objects)
            };
    Expr res = make_list(exec, arr, 3);
    return res;
}